

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfArguments.c
# Opt level: O0

void sbfArguments_destroy(sbfArguments a)

{
  void *in_RDI;
  u_int i;
  uint local_c;
  
  for (local_c = 0; local_c < 0xff; local_c = local_c + 1) {
    free(*(void **)((long)in_RDI + (ulong)local_c * 8 + 0x100));
  }
  for (local_c = 0; local_c < *(uint *)((long)in_RDI + 0x900); local_c = local_c + 1) {
    free(*(void **)(*(long *)((long)in_RDI + 0x8f8) + (ulong)local_c * 8));
  }
  free(*(void **)((long)in_RDI + 0x8f8));
  free(in_RDI);
  return;
}

Assistant:

void
sbfArguments_destroy (sbfArguments a)
{
    u_int i;

    for (i = 0; i < SBF_ARRAYSIZE (a->mOptions); i++)
        free ((void*)a->mValues[i]);

    for (i = 0; i < a->mArgumentsSize; i++)
        free ((void*)a->mArguments[i]);
    free (a->mArguments);

    free (a);
}